

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

bool flatbuffers::Verify(Schema *schema,Object *root,uint8_t *buf,size_t length,uoffset_t max_depth,
                        uoffset_t max_tables)

{
  bool bVar1;
  Table *table;
  Verifier v;
  Verifier local_48;
  
  local_48.opts_.check_alignment = true;
  local_48.opts_.check_nested_flatbuffers = true;
  local_48.opts_.max_size = 0x7fffffff;
  local_48.opts_.assert = false;
  local_48.upper_bound_ = 0;
  local_48.depth_ = 0;
  local_48.num_tables_ = 0;
  local_48.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_48.buf_ = buf;
  local_48.size_ = length;
  local_48.opts_.max_depth = max_depth;
  local_48.opts_.max_tables = max_tables;
  if (length < 0x7fffffff) {
    if (buf == (uint8_t *)0x0) {
      table = (Table *)0x0;
    }
    else {
      table = (Table *)(buf + *(uint *)buf);
    }
    bVar1 = anon_unknown_101::VerifyObject(&local_48,schema,root,table,true);
    return bVar1;
  }
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

bool Verify(const reflection::Schema &schema, const reflection::Object &root,
            const uint8_t *const buf, const size_t length,
            const uoffset_t max_depth, const uoffset_t max_tables) {
  Verifier v(buf, length, max_depth, max_tables);
  return VerifyObject(v, schema, root, flatbuffers::GetAnyRoot(buf),
                      /*required=*/true);
}